

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

Boolean ma_table_verify(Integer handle,char *caller)

{
  char *in_RSI;
  long in_RDI;
  bool bVar1;
  Boolean badhandle;
  char *emsg;
  ulong local_8;
  
  if (((in_RDI < 0) || (ma_table_capacity <= in_RDI)) || (ma_table[in_RDI].state == TES_Unused)) {
    sprintf(ma_ebuf,"handle %ld is not valid",in_RDI);
    emsg = (char *)0x1;
  }
  else {
    bVar1 = ma_table[in_RDI].state == TES_Deallocated;
    if (bVar1) {
      sprintf(ma_ebuf,"handle %ld already deallocated",in_RDI);
    }
    emsg = (char *)(ulong)bVar1;
  }
  if (emsg != (char *)0x0) {
    ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,in_RSI,emsg);
  }
  local_8 = (ulong)(emsg == (char *)0x0);
  return local_8;
}

Assistant:

public Boolean ma_table_verify(handle, caller)
    Integer    handle;        /* to verify */
    char    *caller;    /* name of calling routine */
{
    Boolean    badhandle;    /* is handle invalid? */

    badhandle = MA_FALSE;

    /* if handle is invalid, construct an error message */
    if ((handle < 0) ||
        (handle >= ma_table_capacity) ||
        (ma_table[handle].state == TES_Unused))
    {
        (void)sprintf(ma_ebuf,
            "handle %ld is not valid",
            (long)handle);
        badhandle = MA_TRUE;
    }
    else if (ma_table[handle].state == TES_Deallocated)
    {
        (void)sprintf(ma_ebuf,
            "handle %ld already deallocated",
            (long)handle);
        badhandle = MA_TRUE;
    }

    if (badhandle)
    {
        /* invalid handle */
        ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
        return MA_FALSE;
    }
    else
        /* valid handle */
        return MA_TRUE;
}